

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O2

void __thiscall QNetworkProxy::setHeaders(QNetworkProxy *this,QHttpHeaders *newHeaders)

{
  QNetworkProxyPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  if (pQVar1->type != HttpProxy) {
    pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
    if (pQVar1->type != HttpCachingProxy) {
      return;
    }
  }
  pQVar1 = QSharedDataPointer<QNetworkProxyPrivate>::operator->(&this->d);
  QNetworkHeadersPrivate::setHeaders(&pQVar1->headers,newHeaders);
  return;
}

Assistant:

void QNetworkProxy::setHeaders(const QHttpHeaders &newHeaders)
{
    if (d->type == HttpProxy || d->type == HttpCachingProxy)
        d->headers.setHeaders(newHeaders);
}